

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_align_search.c
# Opt level: O1

ps_seg_t * state_align_search_seg_iter(ps_search_t *search)

{
  ps_alignment_iter_t *ppVar1;
  ps_seg_t *seg;
  
  if (((ps_alignment_t *)search[1].type != (ps_alignment_t *)0x0) &&
     (ppVar1 = ps_alignment_words((ps_alignment_t *)search[1].type),
     ppVar1 != (ps_alignment_iter_t *)0x0)) {
    seg = (ps_seg_t *)
          __ckd_calloc__(1,0x40,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                         ,0x167);
    seg->vt = &state_align_segfuncs;
    seg->search = search;
    seg[1].vt = (ps_segfuncs_t *)ppVar1;
    state_align_search_fill_iter(seg);
    return seg;
  }
  return (ps_seg_t *)0x0;
}

Assistant:

static ps_seg_t *
state_align_search_seg_iter(ps_search_t * search)
{
    state_align_search_t *sas = (state_align_search_t *) search;
    state_align_seg_t *seg;
    ps_alignment_iter_t *itor;

    if (sas->al == NULL)
        return NULL;
    /* Even though the alignment has a bunch of levels, for the
       purposes of the decoder API we will just iterate over words,
       which is the most likely/useful use case.  We will also expose
       the rest of the alignment API separately. */

    itor = ps_alignment_words(sas->al);
    if (itor == NULL)
        return NULL;
    seg = ckd_calloc(1, sizeof(state_align_seg_t));
    seg->base.vt = &state_align_segfuncs;
    seg->base.search = search;
    seg->itor = itor;
    state_align_search_fill_iter((ps_seg_t *)seg);

    return (ps_seg_t *)seg;
}